

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O0

bool directory_exists(string *path)

{
  int iVar1;
  char *__file;
  stat info;
  stat64 local_a0;
  bool local_1;
  
  __file = (char *)std::__cxx11::string::c_str();
  iVar1 = stat64(__file,&local_a0);
  local_1 = iVar1 == 0 && (local_a0.st_mode & 0x4000) != 0;
  return local_1;
}

Assistant:

bool directory_exists(string path)
{
  struct stat info;
  if (stat(path.c_str(), &info) != 0)
    return false;
  else
    return (info.st_mode & S_IFDIR) > 0;
  //  boost::filesystem::path p(path);
  //  return boost::filesystem::exists(p) && boost::filesystem::is_directory(p);
}